

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

TermSpec __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::deref
          (InstMatcher *this,TermList var)

{
  bool bVar1;
  uint64_t extraout_RAX;
  uint64_t in_RSI;
  TermList *in_RDI;
  TermSpec TVar2;
  TermSpec res;
  TermSpec *in_stack_ffffffffffffffb8;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffc8;
  byte local_30;
  uint64_t local_28;
  TermList local_18;
  TermSpec local_10;
  
  local_18._content = in_RSI;
  do {
    TermSpec::TermSpec((TermSpec *)0x3d4972);
    bVar1 = Lib::
            DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::find(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8);
    if (!bVar1) {
      bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x3d4998);
      TermSpec::TermSpec(&local_10,(bool)(-bVar1 & 1),local_18);
      local_28 = extraout_RAX;
LAB_003d4a0d:
      TVar2._1_7_ = (undefined7)(local_28 >> 8);
      TVar2.q = local_10.q;
      TVar2.t._content = local_10.t._content;
      return TVar2;
    }
    bVar1 = Kernel::TermList::isTerm((TermList *)0x3d49c9);
    if ((bVar1) ||
       (((local_30 & 1) == 0 &&
        (bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x3d49e2), bVar1)))) {
      local_10.q = (bool)local_30;
      local_10.t._content = local_28;
      goto LAB_003d4a0d;
    }
    local_18._content = local_28;
  } while( true );
}

Assistant:

typename SubstitutionTree<LeafData_>::InstMatcher::TermSpec SubstitutionTree<LeafData_>::InstMatcher::deref(TermList var)
{
  ASS_REP(var.isVar(), var.tag());

#if VDEBUG
  int ctr=0;
#endif
  for(;;) {
    TermSpec res;
    if(!_bindings.find(var, res)) {
	return TermSpec(var.isOrdinaryVar() ? true : false, var);
    }
    if( res.t.isTerm() || (!res.q && res.t.isOrdinaryVar()) ) {
	return res;
    }
    ASS(!res.q || !res.t.isSpecialVar());
    var=res.t;
#if VDEBUG
    ctr++;
    ASS_L(ctr,1000000); //assert that there are no cycles
#endif
  }
}